

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDtdPtr xmlSAXParseDTD(xmlSAXHandlerPtr sax,xmlChar *ExternalID,xmlChar *SystemID)

{
  int iVar1;
  xmlCharEncoding enc_00;
  xmlParserCtxtPtr ctxt_00;
  xmlChar *pxVar2;
  xmlDocPtr pxVar3;
  xmlDtdPtr pxVar4;
  _xmlNode *local_58;
  xmlNodePtr tmp;
  xmlChar *systemIdCanonic;
  xmlParserInputPtr pxStack_40;
  xmlCharEncoding enc;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  xmlDtdPtr ret;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  xmlSAXHandlerPtr sax_local;
  
  ctxt = (xmlParserCtxtPtr)0x0;
  pxStack_40 = (xmlParserInputPtr)0x0;
  if ((ExternalID == (xmlChar *)0x0) && (SystemID == (xmlChar *)0x0)) {
    sax_local = (xmlSAXHandlerPtr)0x0;
  }
  else {
    ctxt_00 = xmlNewSAXParserCtxt(sax,(void *)0x0);
    if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
      sax_local = (xmlSAXHandlerPtr)0x0;
    }
    else {
      ctxt_00->options = ctxt_00->options | 4;
      pxVar2 = xmlCanonicPath(SystemID);
      if ((SystemID == (xmlChar *)0x0) || (pxVar2 != (xmlChar *)0x0)) {
        if ((ctxt_00->sax != (_xmlSAXHandler *)0x0) &&
           (ctxt_00->sax->resolveEntity != (resolveEntitySAXFunc)0x0)) {
          pxStack_40 = (*ctxt_00->sax->resolveEntity)(ctxt_00->userData,ExternalID,pxVar2);
        }
        if (pxStack_40 == (xmlParserInputPtr)0x0) {
          xmlFreeParserCtxt(ctxt_00);
          if (pxVar2 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar2);
          }
          sax_local = (xmlSAXHandlerPtr)0x0;
        }
        else {
          iVar1 = xmlPushInput(ctxt_00,pxStack_40);
          if (iVar1 < 0) {
            xmlFreeParserCtxt(ctxt_00);
            if (pxVar2 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar2);
            }
            sax_local = (xmlSAXHandlerPtr)0x0;
          }
          else {
            if (3 < (long)ctxt_00->input->end - (long)ctxt_00->input->cur) {
              enc_00 = xmlDetectCharEncoding(ctxt_00->input->cur,4);
              xmlSwitchEncoding(ctxt_00,enc_00);
            }
            if (pxStack_40->filename == (char *)0x0) {
              pxStack_40->filename = (char *)pxVar2;
            }
            else {
              (*xmlFree)(pxVar2);
            }
            pxStack_40->line = 1;
            pxStack_40->col = 1;
            pxStack_40->base = ctxt_00->input->cur;
            pxStack_40->cur = ctxt_00->input->cur;
            pxStack_40->free = (xmlParserInputDeallocate)0x0;
            ctxt_00->inSubset = 2;
            pxVar3 = xmlNewDoc("1.0");
            ctxt_00->myDoc = pxVar3;
            if (ctxt_00->myDoc == (xmlDocPtr)0x0) {
              xmlErrMemory(ctxt_00,"New Doc failed");
              xmlFreeParserCtxt(ctxt_00);
              sax_local = (xmlSAXHandlerPtr)0x0;
            }
            else {
              ctxt_00->myDoc->properties = 0x40;
              pxVar4 = xmlNewDtd(ctxt_00->myDoc,(xmlChar *)"none",ExternalID,SystemID);
              ctxt_00->myDoc->extSubset = pxVar4;
              xmlParseExternalSubset(ctxt_00,ExternalID,SystemID);
              if (ctxt_00->myDoc != (xmlDocPtr)0x0) {
                if (ctxt_00->wellFormed == 0) {
                  ctxt = (xmlParserCtxtPtr)0x0;
                }
                else {
                  ctxt = (xmlParserCtxtPtr)ctxt_00->myDoc->extSubset;
                  ctxt_00->myDoc->extSubset = (_xmlDtd *)0x0;
                  if (ctxt != (xmlParserCtxtPtr)0x0) {
                    *(_xmlDoc **)&ctxt->inputNr = (_xmlDoc *)0x0;
                    for (local_58 = *(_xmlNode **)&ctxt->wellFormed; local_58 != (_xmlNode *)0x0;
                        local_58 = local_58->next) {
                      local_58->doc = (_xmlDoc *)0x0;
                    }
                  }
                }
                xmlFreeDoc(ctxt_00->myDoc);
                ctxt_00->myDoc = (xmlDocPtr)0x0;
              }
              xmlFreeParserCtxt(ctxt_00);
              sax_local = (xmlSAXHandlerPtr)ctxt;
            }
          }
        }
      }
      else {
        xmlFreeParserCtxt(ctxt_00);
        sax_local = (xmlSAXHandlerPtr)0x0;
      }
    }
  }
  return (xmlDtdPtr)sax_local;
}

Assistant:

xmlDtdPtr
xmlSAXParseDTD(xmlSAXHandlerPtr sax, const xmlChar *ExternalID,
                          const xmlChar *SystemID) {
    xmlDtdPtr ret = NULL;
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input = NULL;
    xmlCharEncoding enc;
    xmlChar* systemIdCanonic;

    if ((ExternalID == NULL) && (SystemID == NULL)) return(NULL);

    ctxt = xmlNewSAXParserCtxt(sax, NULL);
    if (ctxt == NULL) {
	return(NULL);
    }

    /* We are loading a DTD */
    ctxt->options |= XML_PARSE_DTDLOAD;

    /*
     * Canonicalise the system ID
     */
    systemIdCanonic = xmlCanonicPath(SystemID);
    if ((SystemID != NULL) && (systemIdCanonic == NULL)) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    /*
     * Ask the Entity resolver to load the damn thing
     */

    if ((ctxt->sax != NULL) && (ctxt->sax->resolveEntity != NULL))
	input = ctxt->sax->resolveEntity(ctxt->userData, ExternalID,
	                                 systemIdCanonic);
    if (input == NULL) {
	xmlFreeParserCtxt(ctxt);
	if (systemIdCanonic != NULL)
	    xmlFree(systemIdCanonic);
	return(NULL);
    }

    /*
     * plug some encoding conversion routines here.
     */
    if (xmlPushInput(ctxt, input) < 0) {
	xmlFreeParserCtxt(ctxt);
	if (systemIdCanonic != NULL)
	    xmlFree(systemIdCanonic);
	return(NULL);
    }
    if ((ctxt->input->end - ctxt->input->cur) >= 4) {
	enc = xmlDetectCharEncoding(ctxt->input->cur, 4);
	xmlSwitchEncoding(ctxt, enc);
    }

    if (input->filename == NULL)
	input->filename = (char *) systemIdCanonic;
    else
	xmlFree(systemIdCanonic);
    input->line = 1;
    input->col = 1;
    input->base = ctxt->input->cur;
    input->cur = ctxt->input->cur;
    input->free = NULL;

    /*
     * let's parse that entity knowing it's an external subset.
     */
    ctxt->inSubset = 2;
    ctxt->myDoc = xmlNewDoc(BAD_CAST "1.0");
    if (ctxt->myDoc == NULL) {
	xmlErrMemory(ctxt, "New Doc failed");
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    ctxt->myDoc->properties = XML_DOC_INTERNAL;
    ctxt->myDoc->extSubset = xmlNewDtd(ctxt->myDoc, BAD_CAST "none",
	                               ExternalID, SystemID);
    xmlParseExternalSubset(ctxt, ExternalID, SystemID);

    if (ctxt->myDoc != NULL) {
	if (ctxt->wellFormed) {
	    ret = ctxt->myDoc->extSubset;
	    ctxt->myDoc->extSubset = NULL;
	    if (ret != NULL) {
		xmlNodePtr tmp;

		ret->doc = NULL;
		tmp = ret->children;
		while (tmp != NULL) {
		    tmp->doc = NULL;
		    tmp = tmp->next;
		}
	    }
	} else {
	    ret = NULL;
	}
        xmlFreeDoc(ctxt->myDoc);
        ctxt->myDoc = NULL;
    }
    xmlFreeParserCtxt(ctxt);

    return(ret);
}